

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall btMultiBodyDynamicsWorld::applyGravity(btMultiBodyDynamicsWorld *this)

{
  btMultiBody *this_00;
  bool bVar1;
  int iVar2;
  btMultiBody **ppbVar3;
  btMultiBodyLinkCollider *pbVar4;
  btCollisionObject *this_01;
  btMultibodyLink *pbVar5;
  long in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar6;
  undefined4 uVar7;
  btVector3 bVar8;
  int j;
  int b;
  bool isSleeping;
  btMultiBody *bod;
  int i;
  CProfileSample __profile;
  undefined1 in_stack_fffffffffffffec8 [16];
  undefined1 in_stack_fffffffffffffed8 [16];
  int local_48;
  int local_30;
  int local_10;
  
  btDiscreteDynamicsWorld::applyGravity(in_stack_fffffffffffffed8._8_8_);
  CProfileSample::CProfileSample(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_);
  for (local_10 = 0;
      iVar2 = btAlignedObjectArray<btMultiBody_*>::size
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8)), local_10 < iVar2;
      local_10 = local_10 + 1) {
    ppbVar3 = btAlignedObjectArray<btMultiBody_*>::operator[]
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_10);
    this_00 = *ppbVar3;
    bVar1 = false;
    pbVar4 = btMultiBody::getBaseCollider(this_00);
    if (pbVar4 != (btMultiBodyLinkCollider *)0x0) {
      this_01 = (btCollisionObject *)btMultiBody::getBaseCollider(this_00);
      iVar2 = btCollisionObject::getActivationState(this_01);
      if (iVar2 == 2) {
        bVar1 = true;
      }
    }
    for (local_30 = 0; iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x2511c8), local_30 < iVar2;
        local_30 = local_30 + 1) {
      pbVar5 = btMultiBody::getLink(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._4_4_)
      ;
      if (pbVar5->m_collider != (btMultiBodyLinkCollider *)0x0) {
        pbVar5 = btMultiBody::getLink
                           (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._4_4_);
        iVar2 = btCollisionObject::getActivationState((btCollisionObject *)pbVar5->m_collider);
        if (iVar2 == 2) {
          bVar1 = true;
        }
      }
    }
    if (!bVar1) {
      btMultiBody::getBaseMass(this_00);
      ::operator*(in_stack_fffffffffffffed8._8_8_,in_stack_fffffffffffffed8._0_8_);
      uVar6 = extraout_XMM0_Dc;
      uVar7 = extraout_XMM0_Dd;
      btMultiBody::addBaseForce(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_);
      for (local_48 = 0; iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x251345), local_48 < iVar2
          ; local_48 = local_48 + 1) {
        btMultiBody::getLinkMass(in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._4_4_);
        bVar8 = ::operator*(in_stack_fffffffffffffed8._8_8_,in_stack_fffffffffffffed8._0_8_);
        in_stack_fffffffffffffec8._8_4_ = uVar6;
        in_stack_fffffffffffffec8._0_8_ = bVar8.m_floats._8_8_;
        in_stack_fffffffffffffec8._12_4_ = uVar7;
        in_stack_fffffffffffffed8._8_4_ = extraout_XMM0_Dc_00;
        in_stack_fffffffffffffed8._0_8_ = bVar8.m_floats._0_8_;
        in_stack_fffffffffffffed8._12_4_ = extraout_XMM0_Dd_00;
        uVar6 = extraout_XMM0_Dc_00;
        uVar7 = extraout_XMM0_Dd_00;
        btMultiBody::addLinkForce
                  (in_stack_fffffffffffffed8._8_8_,(int)bVar8.m_floats[1],
                   in_stack_fffffffffffffec8._8_8_);
      }
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x251431);
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::applyGravity()
{
        btDiscreteDynamicsWorld::applyGravity();
#ifdef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
        BT_PROFILE("btMultiBody addGravity");
        for (int i=0;i<this->m_multiBodies.size();i++)
        {
                btMultiBody* bod = m_multiBodies[i];

                bool isSleeping = false;

                if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                {
                        isSleeping = true;
                }
                for (int b=0;b<bod->getNumLinks();b++)
                {
                        if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                isSleeping = true;
                }

                if (!isSleeping)
                {
                        bod->addBaseForce(m_gravity * bod->getBaseMass());

                        for (int j = 0; j < bod->getNumLinks(); ++j)
                        {
                                bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
                        }
                }//if (!isSleeping)
        }
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
}